

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

void Bfree(Bigint *v)

{
  malloc_tree_chunk *pmVar1;
  long lVar2;
  char *pcVar3;
  malloc_tree_chunk **ppmVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  malloc_tree_chunk *pmVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  tbinptr pmVar13;
  tbinptr pmVar14;
  tbinptr pmVar15;
  uint uVar16;
  tbinptr pmVar17;
  mstate m;
  tbinptr pmVar18;
  malloc_tree_chunk **ppmVar19;
  size_t __len;
  
  iVar5 = _gm_.mutex;
  if (v == (Bigint *)0x0) {
    return;
  }
  lVar10 = (long)v->k;
  if (lVar10 < 8) {
    v->next = TI0.Freelist[lVar10];
    TI0.Freelist[lVar10] = v;
    return;
  }
  if (v == (Bigint *)0x0) {
    return;
  }
  pmVar15 = (tbinptr)&v[-1].sign;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar16 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar5 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar16 & 0x3f) == 0) {
          sched_yield();
        }
        uVar16 = uVar16 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  if ((pmVar15 < _gm_.least_addr) || (uVar7 = *(ulong *)v[-1].x, ((uint)uVar7 & 3) == 1))
  goto LAB_0010ca1d;
  sVar6 = uVar7 & 0xfffffffffffffff8;
  pmVar14 = (tbinptr)((long)pmVar15 + sVar6);
  if ((uVar7 & 1) != 0) goto LAB_0010c583;
  uVar8 = *(ulong *)pmVar15;
  if ((uVar7 & 2) == 0) {
    __len = sVar6 + uVar8 + 0x20;
    iVar5 = munmap((void *)((long)pmVar15 - uVar8),__len);
    sVar6 = _gm_.dvsize;
    if (iVar5 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
    }
    goto LAB_0010c9f5;
  }
  pmVar15 = (tbinptr)((long)pmVar15 - uVar8);
  if (pmVar15 < _gm_.least_addr) goto LAB_0010ca1d;
  sVar6 = sVar6 + uVar8;
  if (pmVar15 == (tbinptr)_gm_.dv) {
    if ((~(uint)pmVar14->head & 3) == 0) {
      _gm_.dvsize = sVar6;
      pmVar14->head = pmVar14->head & 0xfffffffffffffffe;
      pmVar15->head = sVar6 | 1;
      pmVar14->prev_foot = sVar6;
      sVar6 = _gm_.dvsize;
      goto LAB_0010c9f5;
    }
  }
  else if (uVar8 < 0x100) {
    pmVar9 = pmVar15->fd;
    pmVar1 = pmVar15->bk;
    if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar8 >> 3) * 2)) &&
       ((pmVar9 < _gm_.least_addr || (pmVar9->bk != pmVar15)))) goto LAB_0010ca1d;
    if (pmVar1 == pmVar9) {
      bVar11 = (byte)(uVar8 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
    }
    else {
      if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar8 >> 3) * 2)) &&
         ((pmVar1 < _gm_.least_addr || (pmVar1->fd != pmVar15)))) goto LAB_0010ca1d;
      pmVar9->bk = pmVar1;
      pmVar1->fd = pmVar9;
    }
  }
  else {
    pmVar17 = pmVar15->bk;
    pmVar9 = pmVar15->child[2];
    if (pmVar17 == pmVar15) {
      if (pmVar15->child[1] == (tbinptr)0x0) {
        if (pmVar15->child[0] == (tbinptr)0x0) {
          pmVar17 = (tbinptr)0x0;
          goto LAB_0010c4e0;
        }
        pmVar13 = pmVar15->child[0];
        ppmVar4 = pmVar15->child;
      }
      else {
        pmVar13 = pmVar15->child[1];
        ppmVar4 = pmVar15->child + 1;
      }
      do {
        do {
          ppmVar19 = ppmVar4;
          pmVar17 = pmVar13;
          pmVar13 = pmVar17->child[1];
          ppmVar4 = pmVar17->child + 1;
        } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
        pmVar13 = pmVar17->child[0];
        ppmVar4 = pmVar17->child;
      } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar19 < _gm_.least_addr) goto LAB_0010ca1d;
      *ppmVar19 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar1 = pmVar15->fd;
      if (((pmVar1 < _gm_.least_addr) || (pmVar1->bk != pmVar15)) || (pmVar17->fd != pmVar15))
      goto LAB_0010ca1d;
      pmVar1->bk = pmVar17;
      pmVar17->fd = pmVar1;
    }
LAB_0010c4e0:
    if (pmVar9 != (malloc_tree_chunk *)0x0) {
      uVar16 = *(uint *)(pmVar15->child + 3);
      if (pmVar15 == _gm_.treebins[uVar16]) {
        _gm_.treebins[uVar16] = pmVar17;
        if (pmVar17 == (tbinptr)0x0) {
          bVar11 = (byte)uVar16 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        }
        else {
LAB_0010c52c:
          pcVar3 = _gm_.least_addr;
          if (pmVar17 < _gm_.least_addr) goto LAB_0010ca1d;
          pmVar17->child[2] = pmVar9;
          pmVar9 = pmVar15->child[0];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < pcVar3) goto LAB_0010ca1d;
            pmVar17->child[0] = pmVar9;
            pmVar9->parent = pmVar17;
          }
          pmVar9 = pmVar15->child[1];
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar9 < pcVar3) goto LAB_0010ca1d;
            pmVar17->child[1] = pmVar9;
            pmVar9->parent = pmVar17;
          }
        }
      }
      else {
        if (pmVar9 < _gm_.least_addr) goto LAB_0010ca1d;
        pmVar9->child[pmVar9->child[0] != pmVar15] = pmVar17;
        if (pmVar17 != (tbinptr)0x0) goto LAB_0010c52c;
      }
    }
  }
LAB_0010c583:
  if ((pmVar14 <= pmVar15) || (uVar7 = pmVar14->head, (uVar7 & 1) == 0)) goto LAB_0010ca1d;
  if ((uVar7 & 2) == 0) {
    if (pmVar14 == (tbinptr)_gm_.top) {
      uVar8 = sVar6 + _gm_.topsize;
      _gm_.topsize = uVar8;
      _gm_.top = (mchunkptr)pmVar15;
      pmVar15->head = uVar8 | 1;
      if (pmVar15 == (tbinptr)_gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      sVar6 = _gm_.dvsize;
      if (_gm_.trim_check < uVar8) {
        sys_trim((mstate)0x0,uVar7);
        sVar6 = _gm_.dvsize;
      }
      goto LAB_0010c9f5;
    }
    if (pmVar14 == (tbinptr)_gm_.dv) {
      uVar7 = sVar6 + _gm_.dvsize;
      _gm_.dvsize = uVar7;
      _gm_.dv = (mchunkptr)pmVar15;
      pmVar15->head = uVar7 | 1;
      *(ulong *)((long)&pmVar15->prev_foot + uVar7) = uVar7;
      sVar6 = _gm_.dvsize;
      goto LAB_0010c9f5;
    }
    if (uVar7 < 0x100) {
      pmVar9 = pmVar14->fd;
      pmVar1 = pmVar14->bk;
      if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar7 >> 3) * 2)) &&
         ((pmVar9 < _gm_.least_addr || (pmVar9->bk != pmVar14)))) goto LAB_0010ca1d;
      if (pmVar1 == pmVar9) {
        bVar11 = (byte)(uVar7 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar7 >> 3) * 2)) &&
           ((pmVar1 < _gm_.least_addr || (pmVar1->fd != pmVar14)))) goto LAB_0010ca1d;
        pmVar9->bk = pmVar1;
        pmVar1->fd = pmVar9;
      }
    }
    else {
      pmVar17 = pmVar14->bk;
      pmVar9 = pmVar14->child[2];
      if (pmVar17 == pmVar14) {
        if (pmVar14->child[1] == (tbinptr)0x0) {
          if (pmVar14->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_0010c930;
          }
          pmVar13 = pmVar14->child[0];
          ppmVar4 = pmVar14->child;
        }
        else {
          pmVar13 = pmVar14->child[1];
          ppmVar4 = pmVar14->child + 1;
        }
        do {
          do {
            ppmVar19 = ppmVar4;
            pmVar17 = pmVar13;
            pmVar13 = pmVar17->child[1];
            ppmVar4 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar13 = pmVar17->child[0];
          ppmVar4 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_0010ca1d;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar1 = pmVar14->fd;
        if (((pmVar1 < _gm_.least_addr) || (pmVar1->bk != pmVar14)) || (pmVar17->fd != pmVar14))
        goto LAB_0010ca1d;
        pmVar1->bk = pmVar17;
        pmVar17->fd = pmVar1;
      }
LAB_0010c930:
      if (pmVar9 != (malloc_tree_chunk *)0x0) {
        uVar16 = *(uint *)(pmVar14->child + 3);
        if (pmVar14 == _gm_.treebins[uVar16]) {
          _gm_.treebins[uVar16] = pmVar17;
          if (pmVar17 == (tbinptr)0x0) {
            bVar11 = (byte)uVar16 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_0010c97c:
            pcVar3 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_0010ca1d;
            pmVar17->child[2] = pmVar9;
            pmVar9 = pmVar14->child[0];
            if (pmVar9 != (malloc_tree_chunk *)0x0) {
              if (pmVar9 < pcVar3) goto LAB_0010ca1d;
              pmVar17->child[0] = pmVar9;
              pmVar9->parent = pmVar17;
            }
            pmVar9 = pmVar14->child[1];
            if (pmVar9 != (malloc_tree_chunk *)0x0) {
              if (pmVar9 < pcVar3) goto LAB_0010ca1d;
              pmVar17->child[1] = pmVar9;
              pmVar9->parent = pmVar17;
            }
          }
        }
        else {
          if (pmVar9 < _gm_.least_addr) goto LAB_0010ca1d;
          pmVar9->child[pmVar9->child[0] != pmVar14] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_0010c97c;
        }
      }
    }
    sVar6 = sVar6 + (uVar7 & 0xfffffffffffffff8);
    pmVar15->head = sVar6 | 1;
    *(size_t *)((long)&pmVar15->prev_foot + sVar6) = sVar6;
    if (pmVar15 == (tbinptr)_gm_.dv) goto LAB_0010c9f5;
  }
  else {
    pmVar14->head = uVar7 & 0xfffffffffffffffe;
    pmVar15->head = sVar6 | 1;
    *(size_t *)((long)&pmVar15->prev_foot + sVar6) = sVar6;
  }
  if (sVar6 < 0x100) {
    uVar7 = sVar6 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar7 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar7 & 0x1f);
      pmVar9 = (malloc_tree_chunk *)(_gm_.smallbins + uVar7 * 2);
    }
    else {
      pmVar9 = (malloc_tree_chunk *)_gm_.smallbins[uVar7 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar7 * 2 + 2] < _gm_.least_addr) {
LAB_0010ca1d:
        abort();
      }
    }
    _gm_.smallbins[uVar7 * 2 + 2] = (mchunkptr)pmVar15;
    pmVar9->bk = pmVar15;
    pmVar15->fd = pmVar9;
    pmVar15->bk = (malloc_tree_chunk *)(_gm_.smallbins + uVar7 * 2);
    sVar6 = _gm_.dvsize;
  }
  else {
    uVar16 = (uint)(sVar6 >> 8);
    if (uVar16 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar16 < 0x10000) {
        uVar12 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uint)((sVar6 >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar12 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar14 = (tbinptr)(_gm_.treebins + uVar12);
    *(uint *)(pmVar15->child + 3) = uVar12;
    pmVar15->child[0] = (malloc_tree_chunk *)0x0;
    pmVar15->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar17 = pmVar14;
    }
    else {
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar10 = sVar6 << (bVar11 & 0x3f);
      pmVar14 = (tbinptr)pmVar14->prev_foot;
      do {
        pmVar13 = pmVar14;
        if ((pmVar13->head & 0xfffffffffffffff8) == sVar6) {
          if ((pmVar13 < _gm_.least_addr) || (pmVar17 = pmVar13->fd, pmVar17 < _gm_.least_addr))
          goto LAB_0010ca1d;
          pmVar14 = (tbinptr)&pmVar13->fd;
          pmVar17->bk = pmVar15;
          lVar10 = 0x30;
          m = (mstate)&DAT_00000010;
          pmVar18 = (tbinptr)0x0;
          goto LAB_0010c868;
        }
        lVar2 = lVar10 >> 0x3f;
        lVar10 = lVar10 * 2;
        pmVar14 = *(tbinptr *)((long)pmVar13 + lVar2 * -8 + 0x20);
      } while (pmVar14 != (tbinptr)0x0);
      pmVar14 = (tbinptr)((long)pmVar13 + lVar2 * -8 + 0x20);
      pmVar17 = pmVar13;
      if (pmVar14 < _gm_.least_addr) goto LAB_0010ca1d;
    }
    m = (mstate)&DAT_00000030;
    lVar10 = 0x10;
    pmVar13 = pmVar15;
    pmVar18 = pmVar15;
LAB_0010c868:
    pmVar14->prev_foot = (size_t)pmVar15;
    *(tbinptr *)((long)m->smallbins + (long)(pmVar15[-2].child + 3)) = pmVar17;
    pmVar15->bk = pmVar13;
    *(tbinptr *)((long)&pmVar15->prev_foot + lVar10) = pmVar18;
    _gm_.release_checks = _gm_.release_checks - 1;
    sVar6 = _gm_.dvsize;
    if (_gm_.release_checks == 0) {
      release_unused_segments(m);
      sVar6 = _gm_.dvsize;
    }
  }
LAB_0010c9f5:
  _gm_.dvsize = sVar6;
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return;
}

Assistant:

static void
Bfree(Bigint *v MTd)
{
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	if (v) {
		if (v->k > Kmax)
			FREE((void*)v);
		else {
#ifdef MULTIPLE_THREADS
			if (!(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(0);
#endif
			v->next = freelist[v->k];
			freelist[v->k] = v;
#ifdef MULTIPLE_THREADS
			if (TI == &TI0)
				FREE_DTOA_LOCK(0);
#endif
			}
		}
	}